

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ising_polynomial_model.hpp
# Opt level: O3

void __thiscall
openjij::test::Graph_IsingPolynomialModel_1_Test::TestBody(Graph_IsingPolynomialModel_1_Test *this)

{
  pointer *ppvVar1;
  int *piVar2;
  pointer piVar3;
  unsigned_long *lhs;
  pointer puVar4;
  ValueType VVar5;
  pointer pvVar6;
  void *pvVar7;
  const_iterator cVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  long lVar10;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *p_Var11;
  __node_base_ptr *pp_Var12;
  string *psVar13;
  undefined8 uVar14;
  char *pcVar15;
  string *psVar16;
  string *psVar17;
  string *psVar18;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var19;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_00;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_04;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_05;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_06;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_07;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_08;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_09;
  initializer_list<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
  __l_10;
  initializer_list<double> __l_11;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_12;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_13;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_14;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_15;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_16;
  initializer_list<signed_char> __l_17;
  initializer_list<signed_char> __l_18;
  IPM bpm;
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  key_list;
  vector<double,_std::allocator<double>_> value_list;
  allocator_type local_5f9;
  undefined1 local_5f8 [16];
  undefined8 local_5e8 [2];
  byte local_5d8;
  undefined1 *local_5d0 [2];
  undefined1 local_5c0 [16];
  undefined1 local_5b0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_5a8;
  undefined1 local_588;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_578;
  undefined1 local_558;
  pointer local_550;
  pointer pvStack_548;
  pointer local_540 [2];
  undefined1 local_530;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_528;
  undefined1 local_508;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8;
  undefined7 uStack_4d7;
  undefined4 auStack_4d0 [2];
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_4c8;
  undefined1 local_4b0 [8];
  pointer local_4a8;
  undefined1 local_498 [40];
  undefined8 local_470;
  undefined1 local_460;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_458;
  undefined1 local_438;
  allocator_type local_423;
  allocator_type local_422;
  allocator_type local_421;
  allocator_type local_420;
  allocator_type local_41f;
  allocator_type local_41e;
  allocator_type local_41d;
  allocator_type local_41c;
  allocator_type local_41b;
  allocator_type local_41a;
  allocator_type local_419;
  undefined1 local_418 [32];
  _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3f8;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  local_3c0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_3a8;
  double local_390;
  double local_388;
  undefined1 local_378 [32];
  __index_type local_358;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 local_330;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  undefined1 local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 local_240;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_238;
  undefined1 local_218;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  undefined1 local_1f0;
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  local_1e0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1c8;
  undefined1 local_1a8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1a0;
  undefined1 local_180;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  __index_type local_150;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_148;
  undefined1 local_128;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_100;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined1 local_d8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined1 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 local_38;
  
  local_418._0_4_ = 1;
  local_3f8._M_buckets._0_1_ = '\0';
  local_3f8._M_bucket_count._0_4_ = 1;
  local_3f8._M_rehash_policy._M_next_resize._0_1_ = 0;
  local_3f8._M_single_bucket._0_4_ = 1;
  local_3a8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  __l._M_len = 3;
  __l._M_array = (iterator)local_418;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_4f8,__l,&local_419);
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"a","");
  local_5d8 = '\x01';
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"a","");
  local_5b0 = 1;
  local_5a8._0_8_ = (long)&local_5a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"a","");
  local_588 = 1;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_5f8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)(local_4e8 + 8),__l_00,&local_41a);
  local_120._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_100 = 0;
  local_f8._0_8_ = (long)&local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"b","");
  local_d8 = 1;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_120;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2a8,__l_01,&local_41b);
  local_578._0_8_ =
       local_2a8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_578._8_8_ =
       local_2a8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_578._16_8_ =
       local_2a8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2a8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558 = 2;
  psVar18 = (string *)local_350;
  local_378._0_4_ = 2;
  local_358 = '\0';
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"b","");
  local_330 = 1;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_378;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2c8,__l_02,&local_41c);
  local_550 = local_2c8.
              super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_548 = local_2c8.
                super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_540[0] = local_2c8.
                 super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2c8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530 = 2;
  psVar16 = (string *)local_260;
  local_288._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_268 = 0;
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>(psVar16,"b","");
  local_240 = 1;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_288;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2e8,__l_03,&local_41d);
  local_528._0_8_ =
       local_2e8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_528._8_8_ =
       local_2e8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_528._16_8_ =
       local_2e8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_508 = 2;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_578;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector(&local_4c8,__l_04,&local_41e);
  local_238._M_first._M_storage = (_Uninitialized<int,_true>)1;
  local_218 = 0;
  local_210._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_1f0 = 0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_238;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_4b0,__l_05,&local_41f);
  local_170._0_8_ = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"a","");
  local_150 = '\x01';
  local_148._M_first._M_storage = (_Uninitialized<int,_true>)1;
  local_128 = 0;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_170;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_498,__l_06,&local_420);
  psVar17 = (string *)local_58;
  local_80._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_60 = 0;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>(psVar17,"b","");
  local_38 = 1;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_80;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_308,__l_07,&local_421);
  local_1c8._0_8_ =
       local_308.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ =
       local_308.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8._16_8_ =
       local_308.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_308.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8 = 2;
  psVar13 = (string *)local_a8;
  local_d0._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_b0 = 0;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>(psVar13,"a","");
  local_88 = 1;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_d0;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_328,__l_08,&local_422);
  local_1a0._0_8_ =
       local_328.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a0._8_8_ =
       local_328.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1a0._16_8_ =
       local_328.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_328.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = 2;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&local_1c8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)(local_498 + 0x18),__l_09,&local_5f9);
  __l_10._M_len = 6;
  __l_10._M_array = (iterator)local_4f8;
  std::
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  ::vector(&local_1e0,__l_10,&local_423);
  lVar10 = 0x78;
  do {
    std::
    vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)(local_4f8 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  lVar10 = -0x50;
  p_Var11 = &local_1a0;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_5f9,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_328);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar13[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_5f9,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar13);
    psVar13[0x20] = (string)0xff;
    psVar13 = psVar13 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_308);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar17[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_d0,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar17);
    psVar17[0x20] = (string)0xff;
    psVar17 = psVar17 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x50;
  p_Var11 = &local_148;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_1c8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x50;
  p_Var11 = &local_210;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)local_170,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x78;
  p_Var11 = &local_528;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_238,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2e8);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar16[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_238,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar16);
    psVar16[0x20] = (string)0xff;
    psVar16 = psVar16 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2c8);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_288,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2a8);
  lVar10 = -0x50;
  p_Var19 = &local_f8;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var19->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)local_378,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&p_Var19->_M_first);
    *(undefined1 *)&(&p_Var19->_M_first)[8]._M_storage = 0xff;
    p_Var19 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)p_Var19 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x78;
  p_Var11 = &local_5a8;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[*(byte *)(&p_Var11->_M_first + 8)]._M_data)
              ((anon_class_1_0_00000001 *)&local_578,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(__index_type *)(&p_Var11->_M_first + 8) = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x78;
  pp_Var12 = &local_3f8._M_single_bucket;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[*(byte *)(pp_Var12 + 4)]._M_data)
              ((anon_class_1_0_00000001 *)local_5f8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)pp_Var12);
    *(__index_type *)(pp_Var12 + 4) = 0xff;
    pp_Var12 = pp_Var12 + -5;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  _local_4d8 = 0xbff8000000000000;
  auStack_4d0[0] = 0;
  auStack_4d0[1] = 0xc0040000;
  local_4e8._0_8_ = (pointer)0x4008000000000000;
  local_4e8._8_8_ = 0xbff0000000000000;
  local_4f8._0_8_ = (pointer)0x4010000000000000;
  local_4f8._8_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4000000000000000;
  __l_11._M_len = 6;
  __l_11._M_array = (iterator)local_4f8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_120._M_first,__l_11,
             (allocator_type *)local_418);
  graph::IsingPolynomialModel<double>::IsingPolynomialModel
            ((IsingPolynomialModel<double> *)local_418,&local_1e0,
             (vector<double,_std::allocator<double>_> *)&local_120._M_first);
  local_5f8._0_4_ = local_418._0_4_;
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"bpm.GetDegree()","2",(int *)local_5f8,
             &local_578._M_first._M_storage);
  if ((internal)local_4f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_4f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x2e,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((long *)local_5f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f8._8_8_);
  }
  local_5f8._0_4_ = (int)((ulong)(local_418._16_8_ - local_418._8_8_) >> 3) * -0x33333333;
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"bpm.GetSystemSize()","5",(int *)local_5f8,
             &local_578._M_first._M_storage);
  if ((internal)local_4f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_4f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x2f,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((long *)local_5f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f8._8_8_);
  }
  local_4f8._0_4_ = 1;
  _local_4d8 = _local_4d8 & 0xffffffffffffff00;
  auStack_4d0[0] = 2;
  local_4b0[0] = 0;
  local_4a8 = (pointer)local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_4b0 + 8),"a","");
  local_498[0x10] = 1;
  psVar18 = (string *)local_5d0;
  local_5f8._0_4_ = 2;
  local_5d8 = '\0';
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"a","");
  local_5b0 = 1;
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)local_5f8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_288._M_first,__l_12,(allocator_type *)&local_80._M_first);
  local_498._24_8_ = local_288._0_8_;
  local_498._32_8_ = local_288._8_8_;
  local_470 = local_288._16_8_;
  local_288._0_8_ = 0;
  local_288._8_8_ = 0;
  local_288._16_8_ = 0;
  local_460 = 2;
  psVar16 = (string *)&local_550;
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_558 = 0;
  local_550 = (pointer)local_540;
  std::__cxx11::string::_M_construct<char_const*>(psVar16,"b","");
  local_530 = 1;
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)&local_578;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_238._M_first,__l_13,(allocator_type *)&local_d0._M_first);
  local_458._0_8_ = local_238._0_8_;
  local_458._8_8_ = local_238._8_8_;
  local_458._16_8_ = local_238._16_8_;
  local_238._0_8_ = 0;
  local_238._8_8_ = 0;
  local_238._16_8_ = 0;
  local_438 = 2;
  __l_14._M_len = 5;
  __l_14._M_array = (iterator)local_4f8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_378,__l_14,(allocator_type *)&local_1c8._M_first);
  testing::internal::
  CmpHelperEQ<std::vector<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::allocator<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>>,std::vector<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::allocator<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>>>
            ((internal *)local_170,"bpm.GetIndexList()",
             "(std::vector<IPM::IndexType>{1, 2, \"a\", Tup{2, \"a\"}, Tup{2, \"b\"}})",
             (vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)(local_418 + 8),
             (vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)local_378);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             *)local_378);
  lVar10 = -200;
  p_Var11 = &local_458;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_1c8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_238._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar16[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_1c8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar16);
    psVar16[0x20] = (string)0xff;
    psVar16 = psVar16 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_288._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_578,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  if ((string)local_170[0] == (string)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_170._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x31,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5f8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5f8);
    if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_4f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_170 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_170._8_8_);
  }
  local_5f8._0_8_ = local_3f8._M_element_count;
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_4f8,"bpm.GetIndexMap().size()","5",(unsigned_long *)local_5f8,
             &local_578._M_first._M_storage);
  if ((internal)local_4f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_4f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x32,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((long *)local_5f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f8._8_8_);
  }
  local_4f8._0_4_ = 1;
  _local_4d8 = _local_4d8 & 0xffffffffffffff00;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3f8,(key_type *)local_4f8);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) goto LAB_0013789b;
  local_578._0_8_ = local_578._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_5f8,"bpm.GetIndexMap().at(1)","0",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_578._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[_local_4d8 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_578,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_4f8);
  if ((string)local_5f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_5f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x33,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_4f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5f8._8_8_);
  }
  local_4f8._0_4_ = 2;
  _local_4d8 = _local_4d8 & 0xffffffffffffff00;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3f8,(key_type *)local_4f8);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_5f8,"bpm.GetIndexMap().at(2)","1",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_578._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[_local_4d8 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_578,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_4f8);
  if ((string)local_5f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_5f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x34,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_4f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5f8._8_8_);
  }
  local_4f8._0_8_ = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"a","");
  local_4d8 = 1;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3f8,(key_type *)local_4f8);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_5f8,"bpm.GetIndexMap().at(\"a\")","2",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_578._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[_local_4d8 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_578,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_4f8);
  if ((string)local_5f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_5f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x35,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_4f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5f8._8_8_);
  }
  psVar18 = (string *)auStack_4d0;
  local_4f8._0_4_ = 2;
  _local_4d8 = _local_4d8 & 0xffffffffffffff00;
  ppvVar1 = &local_4c8.
             super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  auStack_4d0 = (undefined4  [2])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"a","");
  local_4b0[0] = 1;
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)local_4f8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_578._M_first,__l_15,(allocator_type *)&local_238._M_first);
  local_5f8._0_8_ = local_578._0_8_;
  local_5f8._8_8_ = local_578._8_8_;
  local_5e8[0] = local_578._16_8_;
  local_578._0_8_ = 0;
  local_578._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_578._16_8_ = 0;
  local_5d8 = 2;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3f8,(key_type *)local_5f8);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_288._M_first._M_storage = (_Uninitialized<int,_true>)3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_378,"bpm.GetIndexMap().at(Tup{2, \"a\"})","3",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_288._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[local_5d8]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_5f8);
  local_5d8 = 0xff;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_578._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_288,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  if (local_378[0] == '\0') {
    testing::Message::Message((Message *)local_4f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x36,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5f8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5f8);
    if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_4f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_378 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_378._8_8_);
  }
  psVar18 = (string *)auStack_4d0;
  local_4f8._0_4_ = 2;
  _local_4d8 = _local_4d8 & 0xffffffffffffff00;
  auStack_4d0 = (undefined4  [2])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"b","");
  local_4b0[0] = 1;
  __l_16._M_len = 2;
  __l_16._M_array = (iterator)local_4f8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_578._M_first,__l_16,(allocator_type *)&local_238._M_first);
  local_5f8._0_8_ = local_578._0_8_;
  local_5f8._8_8_ = local_578._8_8_;
  local_5e8[0] = local_578._16_8_;
  local_578._0_8_ = 0;
  local_578._8_8_ = (pointer)0x0;
  local_578._16_8_ = (pointer)0x0;
  local_5d8 = 2;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3f8,(key_type *)local_5f8);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_288._M_first._M_storage = (_Uninitialized<int,_true>)4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_378,"bpm.GetIndexMap().at(Tup{2, \"b\"})","4",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_288._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[local_5d8]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_5f8);
  local_5d8 = 0xff;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_578._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_288,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  if (local_378[0] == '\0') {
    testing::Message::Message((Message *)local_4f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x37,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5f8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5f8);
    if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_4f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_378 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_378._8_8_);
  }
  local_5f8._0_8_ =
       (long)local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_578._M_first._M_storage = (_Uninitialized<int,_true>)6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_4f8,"bpm.GetKeyValueList().size()","6",(unsigned_long *)local_5f8,
             &local_578._M_first._M_storage);
  if ((internal)local_4f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_4f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x39,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
    if ((long *)local_5f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5f8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f8._8_8_);
  }
  if (local_3c0.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_3c0.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001378e9:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_001378fc:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_0013790f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
LAB_00137922:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
LAB_00137935:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
LAB_00137948:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0013795a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0013796d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_00137980:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
LAB_00137993:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
LAB_001379a6:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
    uVar9 = extraout_RDX;
LAB_001379b9:
    uVar14 = 1;
LAB_001379c4:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
    uVar9 = extraout_RDX_00;
LAB_001379d2:
    uVar14 = 2;
LAB_001379dd:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_001379eb:
    uVar14 = 2;
LAB_001379f7:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
    uVar9 = extraout_RDX_01;
LAB_00137a05:
    uVar14 = 3;
LAB_00137a10:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
    uVar9 = extraout_RDX_02;
LAB_00137a1e:
    uVar14 = 4;
LAB_00137a29:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137a37:
    uVar14 = 4;
LAB_00137a43:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
    uVar9 = extraout_RDX_03;
LAB_00137a51:
    uVar14 = 5;
LAB_00137a5c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137a6a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00137a7c:
    uVar14 = 0;
    uVar9 = 0;
LAB_00137a87:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137a95:
    uVar14 = 0;
    uVar9 = 0;
LAB_00137aa0:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137aae:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    uVar9 = extraout_RDX_04;
LAB_00137ac1:
    uVar14 = 1;
LAB_00137acc:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137ada:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
    uVar9 = extraout_RDX_05;
LAB_00137aed:
    uVar14 = 2;
LAB_00137af8:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137b06:
    uVar14 = 2;
LAB_00137b12:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
LAB_00137b20:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    uVar9 = extraout_RDX_06;
LAB_00137b33:
    uVar14 = 3;
LAB_00137b3e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00137b4c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
    uVar9 = extraout_RDX_07;
LAB_00137b5f:
    uVar14 = 4;
LAB_00137b6a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
  }
  else {
    local_5f8._0_8_ =
         (long)((local_3c0.
                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)((local_3c0.
                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(0).first.size()","1",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3a,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_001378e9;
    local_5f8._0_8_ =
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(1).first.size()","2",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3b,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) goto LAB_001378fc;
    local_5f8._0_8_ =
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(2).first.size()","2",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3c,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 4) goto LAB_0013790f;
    local_5f8._0_8_ =
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(3).first.size()","1",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3d,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 5) goto LAB_00137922;
    local_5f8._0_8_ =
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[4].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[4].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(4).first.size()","2",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3e,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 6) goto LAB_00137935;
    local_5f8._0_8_ =
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(5).first.size()","1",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3f,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if (local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_00137948;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(0).second","+4.0",
               (local_3c0.
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second,4.0);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x41,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013795a;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(1).second","-1.0",
               local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].second,-1.0);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x42,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) goto LAB_0013796d;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(2).second","-1.5",
               local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].second,-1.5);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x43,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 4) goto LAB_00137980;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(3).second","+2.0",
               local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].second,2.0);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x44,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 5) goto LAB_00137993;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(4).second","-2.5",
               local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[4].second,-2.5);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x45,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 6) goto LAB_001379a6;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(5).second","+3.0",
               local_3c0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5].second,3.0);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x46,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((local_3c0.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         local_3c0.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (piVar2 = ((local_3c0.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
       ((local_3c0.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->first).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
       piVar2)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_00137876;
    }
    local_5f8._0_8_ = local_5f8._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(0).first.at(0)","0",piVar2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x48,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    uVar9 = (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 2) goto LAB_001379b9;
    piVar2 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_001379c4;
    }
    local_5f8._0_8_ = local_5f8._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(1).first.at(0)","0",piVar2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x49,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
LAB_00137876:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_00137889:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0013789b:
      std::__throw_out_of_range("_Map_base::at");
    }
    piVar3 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].first.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) < 2) goto LAB_00137876;
    local_5f8._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(1).first.at(1)","1",piVar3 + 1,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4a,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    uVar9 = (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 3) goto LAB_001379d2;
    piVar2 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_001379dd;
    }
    local_5f8._0_8_ = local_5f8._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(2).first.at(0)","0",piVar2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4b,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) goto LAB_001379eb;
    piVar3 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].first.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) < 2) {
      uVar14 = 1;
      goto LAB_001379f7;
    }
    local_5f8._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(2).first.at(1)","2",piVar3 + 1,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4c,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    uVar9 = (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 4) goto LAB_00137a05;
    piVar2 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137a10;
    }
    local_5f8._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(3).first.at(0)","2",piVar2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4d,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    uVar9 = (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 5) goto LAB_00137a1e;
    piVar2 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[4].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137a29;
    }
    local_5f8._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(4).first.at(0)","3",piVar2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4e,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 5) goto LAB_00137a37;
    piVar3 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)local_3c0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].first.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) < 2) {
      uVar14 = 1;
      goto LAB_00137a43;
    }
    local_5f8._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(4).first.at(1)","4",piVar3 + 1,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4f,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    uVar9 = (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3c0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 6) goto LAB_00137a51;
    piVar2 = local_3c0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3c0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137a5c;
    }
    local_5f8._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_4f8,"bpm.GetKeyValueList().at(5).first.at(0)","4",piVar2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x50,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    local_5f8._0_8_ =
         ((long)local_3a8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          CONCAT71(local_3a8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                   local_3a8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_1_) >> 3) * -0x5555555555555555;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)5;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().size()","5",(unsigned_long *)local_5f8,
               &local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x52,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    pvVar6 = (pointer)CONCAT71(local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (local_3a8.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar6) goto LAB_00137a6a;
    local_5f8._0_8_ =
         (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)3;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(0).size()","3",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x53,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    pvVar6 = (pointer)CONCAT71(local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((local_3a8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == pvVar6) ||
       (lhs = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start,
       (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish == lhs)) goto LAB_00137889;
    local_5f8._0_8_ = local_5f8._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(0).at(0)","0",lhs,(int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x54,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    pvVar6 = (pointer)CONCAT71(local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (local_3a8.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar6) goto LAB_00137a7c;
    puVar4 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
    if (uVar9 < 2) {
      uVar14 = 1;
      goto LAB_00137a87;
    }
    local_5f8._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(0).at(1)","1",puVar4 + 1,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x55,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    pvVar6 = (pointer)CONCAT71(local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_3a8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (local_3a8.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar6) goto LAB_00137a95;
    puVar4 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
    if (uVar9 < 3) {
      uVar14 = 2;
      goto LAB_00137aa0;
    }
    local_5f8._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(0).at(2)","2",puVar4 + 2,
               (int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x56,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_3a8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 2) goto LAB_00137aae;
    local_5f8._0_8_ = *(long *)(lVar10 + 0x20) - *(long *)(lVar10 + 0x18) >> 3;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(1).size()","1",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x57,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_3a8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 2) goto LAB_00137ac1;
    if (*(unsigned_long **)(lVar10 + 0x20) == *(unsigned_long **)(lVar10 + 0x18)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137acc;
    }
    local_5f8._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(1).at(0)","1",
               *(unsigned_long **)(lVar10 + 0x18),(int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x58,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_3a8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 3) goto LAB_00137ada;
    local_5f8._0_8_ = *(long *)(lVar10 + 0x38) - *(long *)(lVar10 + 0x30) >> 3;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(2).size()","2",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x59,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_3a8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 3) goto LAB_00137aed;
    if (*(unsigned_long **)(lVar10 + 0x38) == *(unsigned_long **)(lVar10 + 0x30)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137af8;
    }
    local_5f8._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(2).at(0)","2",
               *(unsigned_long **)(lVar10 + 0x30),(int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5a,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_3a8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 3) goto LAB_00137b06;
    if ((ulong)(*(long *)(lVar10 + 0x38) - *(long *)(lVar10 + 0x30) >> 3) < 2) {
      uVar14 = 1;
      goto LAB_00137b12;
    }
    local_5f8._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(2).at(1)","3",
               (unsigned_long *)(*(long *)(lVar10 + 0x30) + 8),(int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5b,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_3a8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 4) goto LAB_00137b20;
    local_5f8._0_8_ = *(long *)(lVar10 + 0x50) - *(long *)(lVar10 + 0x48) >> 3;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(3).size()","1",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5c,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_3a8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 4) goto LAB_00137b33;
    if (*(unsigned_long **)(lVar10 + 0x50) == *(unsigned_long **)(lVar10 + 0x48)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137b3e;
    }
    local_5f8._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(3).at(0)","4",
               *(unsigned_long **)(lVar10 + 0x48),(int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5d,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_3a8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 5) goto LAB_00137b4c;
    local_5f8._0_8_ = *(long *)(lVar10 + 0x68) - *(long *)(lVar10 + 0x60) >> 3;
    local_578._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(4).size()","2",
               (unsigned_long *)local_5f8,&local_578._M_first._M_storage);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5e,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_3a8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 5) goto LAB_00137b5f;
    if (*(unsigned_long **)(lVar10 + 0x68) == *(unsigned_long **)(lVar10 + 0x60)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00137b6a;
    }
    local_5f8._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_4f8,"bpm.GetAdjacencyList().at(4).at(0)","4",
               *(unsigned_long **)(lVar10 + 0x60),(int *)local_5f8);
    if ((internal)local_4f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5f8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_4f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5f,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
      if ((long *)local_5f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5f8._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f8._8_8_);
    }
    lVar10 = CONCAT71(local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_3a8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (4 < (ulong)(((long)local_3a8.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
                   -0x5555555555555555)) {
      if (1 < (ulong)(*(long *)(lVar10 + 0x68) - *(long *)(lVar10 + 0x60) >> 3)) {
        local_5f8._0_4_ = 5;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_4f8,"bpm.GetAdjacencyList().at(4).at(1)","5",
                   (unsigned_long *)(*(long *)(lVar10 + 0x60) + 8),(int *)local_5f8);
        if ((internal)local_4f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_4f8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x60,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
          if ((long *)local_5f8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5f8._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8._8_8_);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_4f8,"bpm.GetEstimatedMinEnergyDifference()","1.0*2",local_390,
                   2.0);
        if ((internal)local_4f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_4f8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x62,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
          if ((long *)local_5f8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5f8._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8._8_8_);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_4f8,"bpm.GetEstimatedMaxEnergyDifference()","6.5*2",local_388,
                   13.0);
        if ((internal)local_4f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_4f8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,99,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_578._M_first,(Message *)local_5f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
          if ((long *)local_5f8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5f8._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8._8_8_);
        }
        local_578._0_5_ = 0x100000000;
        local_578._M_first._M_storage = (_Uninitialized<int,_true>)0x1010101;
        __l_17._M_len = 5;
        __l_17._M_array = (iterator)&local_578;
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_4f8,__l_17,
                   (allocator_type *)local_378);
        VVar5 = graph::IsingPolynomialModel<double>::CalculateEnergy
                          ((IsingPolynomialModel<double> *)local_418,
                           (vector<signed_char,_std::allocator<signed_char>_> *)local_4f8);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_5f8,
                   "bpm.CalculateEnergy((std::vector<std::int8_t>{1,1,1,1,1}))","4.0",VVar5,4.0);
        if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ - local_4f8._0_8_);
        }
        if ((string)local_5f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_4f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_5f8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x65,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_578._M_first,(Message *)local_4f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
          if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
            (**(code **)(*(long *)local_4f8._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_5f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5f8._8_8_);
        }
        local_578._0_5_ = 0x1010101ff;
        __l_18._M_len = 5;
        __l_18._M_array = (iterator)&local_578;
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_4f8,__l_18,
                   (allocator_type *)local_378);
        VVar5 = graph::IsingPolynomialModel<double>::CalculateEnergy
                          ((IsingPolynomialModel<double> *)local_418,
                           (vector<signed_char,_std::allocator<signed_char>_> *)local_4f8);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_5f8,
                   "bpm.CalculateEnergy((std::vector<std::int8_t>{-1,1,1,1,1}))","1.0",VVar5,1.0);
        if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ - local_4f8._0_8_);
        }
        if ((string)local_5f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_4f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_5f8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_578._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x66,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_578._M_first,(Message *)local_4f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
          if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
            (**(code **)(*(long *)local_4f8._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_5f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5f8._8_8_);
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_3a8);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ::~vector(&local_3c0);
        std::
        _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_3f8);
        std::
        vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)(local_418 + 8));
        pvVar7 = (void *)CONCAT44(local_120._4_4_,local_120._M_first._M_storage);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,local_120._16_8_ - (long)pvVar7);
        }
        std::
        vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
        ::~vector(&local_1e0);
        return;
      }
      uVar14 = 1;
      goto LAB_00137b84;
    }
  }
  uVar14 = 4;
LAB_00137b84:
  uVar14 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar14);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578._M_first);
  if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
    (**(code **)(*(long *)local_4f8._0_8_ + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5f8._8_8_);
  }
  graph::IsingPolynomialModel<double>::~IsingPolynomialModel
            ((IsingPolynomialModel<double> *)local_418);
  pvVar7 = (void *)CONCAT44(local_120._4_4_,local_120._M_first._M_storage);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,local_120._16_8_ - (long)pvVar7);
  }
  std::
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  ::~vector(&local_1e0);
  _Unwind_Resume(uVar14);
}

Assistant:

TEST(Graph, IsingPolynomialModel_1) {
   
   using FloatType = double;
   using Tup = utility::AnyTupleType;
   using IPM = graph::IsingPolynomialModel<FloatType>;
   
   std::vector<std::vector<typename IPM::IndexType>> key_list = {
      {1, 1, 1},
      {"a", "a", "a"},
      {Tup{2, "b"}, Tup{2, "b"}, Tup{2, "b"}},
      {1, 2},
      {"a", 1},
      {Tup{2, "b"}, Tup{2, "a"}}
   };
      
   std::vector<FloatType> value_list = {
      +4.0,
      +2.0,
      +3.0,
      -1.0,
      -1.5,
      -2.5
   };
   
   const auto bpm = IPM{key_list, value_list};
   
   EXPECT_EQ(bpm.GetDegree(), 2);
   EXPECT_EQ(bpm.GetSystemSize(), 5);
   EXPECT_EQ(bpm.GetIndexList(),
             (std::vector<IPM::IndexType>{1, 2, "a", Tup{2, "a"}, Tup{2, "b"}}));
   EXPECT_EQ(bpm.GetIndexMap().size(), 5);
   EXPECT_EQ(bpm.GetIndexMap().at(1)          , 0);
   EXPECT_EQ(bpm.GetIndexMap().at(2)          , 1);
   EXPECT_EQ(bpm.GetIndexMap().at("a")        , 2);
   EXPECT_EQ(bpm.GetIndexMap().at(Tup{2, "a"}), 3);
   EXPECT_EQ(bpm.GetIndexMap().at(Tup{2, "b"}), 4);
   
   EXPECT_EQ(bpm.GetKeyValueList().size(), 6);
   EXPECT_EQ(bpm.GetKeyValueList().at(0).first.size(), 1);
   EXPECT_EQ(bpm.GetKeyValueList().at(1).first.size(), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(2).first.size(), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(3).first.size(), 1);
   EXPECT_EQ(bpm.GetKeyValueList().at(4).first.size(), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(5).first.size(), 1);
   
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(0).second, +4.0);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(1).second, -1.0);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(2).second, -1.5);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(3).second, +2.0);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(4).second, -2.5);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(5).second, +3.0);
   
   EXPECT_EQ(bpm.GetKeyValueList().at(0).first.at(0), 0);
   EXPECT_EQ(bpm.GetKeyValueList().at(1).first.at(0), 0);
   EXPECT_EQ(bpm.GetKeyValueList().at(1).first.at(1), 1);
   EXPECT_EQ(bpm.GetKeyValueList().at(2).first.at(0), 0);
   EXPECT_EQ(bpm.GetKeyValueList().at(2).first.at(1), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(3).first.at(0), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(4).first.at(0), 3);
   EXPECT_EQ(bpm.GetKeyValueList().at(4).first.at(1), 4);
   EXPECT_EQ(bpm.GetKeyValueList().at(5).first.at(0), 4);
   
   EXPECT_EQ(bpm.GetAdjacencyList().size(), 5);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).size(), 3);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).at(0), 0);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).at(1), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).at(2), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(1).size(), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(1).at(0), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(2).size(), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(2).at(0), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(2).at(1), 3);
   EXPECT_EQ(bpm.GetAdjacencyList().at(3).size(), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(3).at(0), 4);
   EXPECT_EQ(bpm.GetAdjacencyList().at(4).size(), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(4).at(0), 4);
   EXPECT_EQ(bpm.GetAdjacencyList().at(4).at(1), 5);

   EXPECT_DOUBLE_EQ(bpm.GetEstimatedMinEnergyDifference(), 1.0*2);
   EXPECT_DOUBLE_EQ(bpm.GetEstimatedMaxEnergyDifference(), 6.5*2);
   
   EXPECT_DOUBLE_EQ(bpm.CalculateEnergy((std::vector<std::int8_t>{1,1,1,1,1})), 4.0);
   EXPECT_DOUBLE_EQ(bpm.CalculateEnergy((std::vector<std::int8_t>{-1,1,1,1,1})), 1.0);
   
}